

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall QGraphicsTextItem::QGraphicsTextItem(QGraphicsTextItem *this,QGraphicsItem *parent)

{
  QGraphicsItemPrivate *this_00;
  undefined8 *puVar1;
  
  this_00 = (QGraphicsItemPrivate *)operator_new(0x178);
  QGraphicsItemPrivate::QGraphicsItemPrivate(this_00);
  QGraphicsObject::QGraphicsObject((QGraphicsObject *)this,this_00,parent);
  *(undefined ***)this = &PTR_metaObject_00820028;
  *(undefined ***)(this + 0x10) = &PTR__QGraphicsTextItem_00820180;
  puVar1 = (undefined8 *)operator_new(0x38);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  *(undefined8 *)((long)puVar1 + 0x1e) = 0;
  *(undefined8 *)((long)puVar1 + 0x26) = 0;
  *(byte *)((long)puVar1 + 0x2e) = *(byte *)((long)puVar1 + 0x2e) & 0xfe;
  *(undefined8 **)(this + 0x20) = puVar1;
  puVar1[6] = this;
  *(ulong *)(*(long *)(this + 0x18) + 0x160) = *(ulong *)(*(long *)(this + 0x18) + 0x160) | 0x800;
  QGraphicsItem::setAcceptHoverEvents((QGraphicsItem *)(this + 0x10),true);
  QGraphicsItem::setFlags
            ((QGraphicsItem *)(this + 0x10),
             (GraphicsItemFlags)(*(uint *)(*(long *)(this + 0x18) + 0x164) & 0xffdff | 0x200));
  return;
}

Assistant:

QGraphicsTextItem::QGraphicsTextItem(QGraphicsItem *parent)
    : QGraphicsObject(*new QGraphicsItemPrivate, parent),
      dd(new QGraphicsTextItemPrivate)
{
    dd->qq = this;
    setAcceptDrops(true);
    setAcceptHoverEvents(true);
    setFlag(ItemUsesExtendedStyleOption);
}